

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::CommandCompare::compareImagesRaw(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  ktx_uint64_t kVar1;
  void *pvVar2;
  format_args args;
  format_args args_00;
  format_args args_01;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  uint *puVar6;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar7;
  reference pvVar8;
  ktxLevelIndexEntry *pkVar9;
  v10 *pvVar10;
  pointer puVar11;
  DiffMismatch *this_00;
  size_t sVar12;
  array<ktx::InputStream,_2UL> *in_RDX;
  DiffMismatch *extraout_RDX;
  size_t in_RSI;
  v10 *pvVar13;
  CommandCompare *in_RDI;
  undefined1 auVar14 [16];
  string_view sVar15;
  size_t i_1;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffers [2];
  bool mismatch;
  ktxLevelIndexEntry entry;
  size_t i;
  optional<ktxLevelIndexEntry> levelIndexEntry [2];
  unsigned_long levelIndexEntryOffset;
  uint32_t level;
  uint32_t maxNumLevels;
  uint32_t numLevels [2];
  string *in_stack_fffffffffffffa78;
  undefined8 uVar16;
  PrintDiff *in_stack_fffffffffffffa80;
  undefined8 uVar17;
  array<ktx::InputStream,_2UL> *this_01;
  DiffMismatch *in_stack_fffffffffffffa88;
  PrintDiff *in_stack_fffffffffffffa90;
  size_t in_stack_fffffffffffffa98;
  allocator<char> *in_stack_fffffffffffffab0;
  size_t *psVar18;
  char *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  undefined1 *local_518;
  void **local_468;
  char *local_448;
  size_t local_440;
  string local_438 [32];
  string_view local_418;
  v10 *local_408 [2];
  string local_3f8 [32];
  string_view local_3d8;
  DiffMismatch local_3c8;
  char *local_3a8 [2];
  string local_398 [32];
  undefined1 local_378 [16];
  v10 *local_368;
  undefined1 *local_360;
  undefined1 local_358 [8];
  undefined1 local_350 [8];
  undefined1 auStack_348 [15];
  byte local_339;
  undefined8 local_338;
  undefined8 local_330;
  v10 local_328 [16];
  unsigned_long_long in_stack_fffffffffffffce8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar19;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar20;
  string_view in_stack_fffffffffffffcf8;
  void *local_2c8;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_2bc;
  uint local_2ac;
  undefined1 local_2a8 [24];
  string local_290 [32];
  array<ktx::InputStream,_2UL> *local_270;
  size_t local_268;
  PrintDiff *local_258 [2];
  undefined8 local_248;
  PrintDiff **local_240;
  char *local_238;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_228;
  char *local_220;
  size_t sStack_218;
  string *local_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_208 [2];
  undefined8 local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_1f0;
  v10 *local_1e8;
  size_t local_1e0;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_1d8;
  v10 *local_1d0;
  size_t sStack_1c8;
  string *local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_1b8 [3];
  undefined8 local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_198;
  char *local_190;
  size_t local_188;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_180;
  char *local_178;
  size_t sStack_170;
  string *local_168;
  char *local_160;
  char **local_158;
  char *local_150;
  v10 **local_148;
  char *local_140;
  char **local_138;
  char *local_130;
  char **local_128;
  char *local_120;
  v10 **local_118;
  char *local_110;
  char **local_108;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_100;
  undefined8 *local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_f0;
  undefined8 local_e8;
  undefined8 *local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_d0;
  undefined8 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_c0;
  undefined8 local_b8;
  undefined8 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_a8;
  PrintDiff **local_a0;
  undefined8 *local_98;
  PrintDiff **local_90;
  undefined8 local_88;
  undefined8 *local_80;
  PrintDiff **local_78;
  char **local_70;
  char *local_68;
  size_t sStack_60;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  char **local_30;
  char *local_28;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_270 = in_RDX;
  local_268 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  PrintDiff::setContext(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)(local_2a8 + 0x17));
  local_2bc.int128_value._12_4_ = 1;
  pvVar5 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[](&in_RDI->headers,0);
  puVar6 = std::max<unsigned_int>((uint *)((long)&local_2bc.string.size + 4),&pvVar5->levelCount);
  local_2ac = *puVar6;
  local_2bc.int128_value._8_4_ = 1;
  pvVar5 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[](&in_RDI->headers,1);
  puVar6 = std::max<unsigned_int>((uint *)&local_2bc.string.size,&pvVar5->levelCount);
  local_2a8._0_4_ = *puVar6;
  this_00 = (DiffMismatch *)local_2a8;
  puVar6 = std::max<unsigned_int>(&local_2ac,(uint *)this_00);
  auVar14._8_8_ = in_stack_fffffffffffffa80;
  auVar14._0_8_ = in_stack_fffffffffffffa78;
  local_2bc.ulong_long_value._4_4_ = *puVar6;
  local_2bc.int_value = 0;
  do {
    if (local_2bc._4_4_ <= local_2bc.uint_value) {
      return;
    }
    local_2c8 = (void *)((ulong)local_2bc.uint_value * 0x18 + 0x50);
    local_468 = (void **)&stack0xfffffffffffffcf8;
    do {
      std::optional<ktxLevelIndexEntry>::optional((optional<ktxLevelIndexEntry> *)0x1685b0);
      local_468 = local_468 + 4;
    } while (local_468 != &local_2c8);
    aVar19.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x0;
    while( true ) {
      aVar20 = aVar19;
      pvVar7 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
               std::array<ktx::InputStream,_2UL>::size(local_270);
      if (pvVar7 <= aVar19.values_) break;
      if (local_2bc.uint_value <
          *(uint *)(local_2a8 + (long)((long)&aVar20.values_[-1].field_0 + 0xf) * 4)) {
        pvVar8 = std::array<ktx::InputStream,_2UL>::operator[](auVar14._8_8_,auVar14._0_8_);
        pvVar2 = local_2c8;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa90,
                   (char *)in_stack_fffffffffffffa88);
        uVar16 = local_338;
        uVar17 = local_330;
        read(in_RDI,(int)pvVar8,pvVar2,(size_t)local_328);
        this_00 = (DiffMismatch *)local_328;
        std::optional<ktxLevelIndexEntry>::operator=
                  ((optional<ktxLevelIndexEntry> *)in_stack_fffffffffffffa90,
                   (ktxLevelIndexEntry *)in_stack_fffffffffffffa88);
        auVar14._8_8_ = uVar17;
        auVar14._0_8_ = uVar16;
      }
      aVar19.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
           ((long)&(aVar20.values_)->field_0 + 1);
    }
    local_339 = 0;
    bVar3 = std::optional<ktxLevelIndexEntry>::has_value((optional<ktxLevelIndexEntry> *)0x16874d);
    if (bVar3) {
      bVar3 = std::optional<ktxLevelIndexEntry>::has_value((optional<ktxLevelIndexEntry> *)0x168764)
      ;
      if (!bVar3) goto LAB_00168768;
    }
    else {
LAB_00168768:
      local_339 = 1;
    }
    if ((local_339 & 1) == 0) {
      pkVar9 = std::optional<ktxLevelIndexEntry>::operator->
                         ((optional<ktxLevelIndexEntry> *)0x168787);
      kVar1 = pkVar9->byteLength;
      pkVar9 = std::optional<ktxLevelIndexEntry>::operator->
                         ((optional<ktxLevelIndexEntry> *)0x1687a4);
      if (kVar1 != pkVar9->byteLength) {
        local_339 = 1;
      }
    }
    if ((local_339 & 1) == 0) {
      local_360 = local_358;
      std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x1687f0);
      std::make_unique<unsigned_char[]>(in_stack_fffffffffffffa98);
      local_360 = local_350;
      std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x168828);
      std::make_unique<unsigned_char[]>(in_stack_fffffffffffffa98);
      local_368 = (v10 *)0x0;
      while( true ) {
        pvVar13 = local_368;
        pvVar10 = (v10 *)std::array<ktx::InputStream,_2UL>::size(local_270);
        this_01 = auVar14._8_8_;
        if (pvVar10 <= pvVar13) break;
        pvVar13 = local_368;
        pvVar8 = std::array<ktx::InputStream,_2UL>::operator[](this_01,auVar14._0_8_);
        pkVar9 = std::optional<ktxLevelIndexEntry>::operator->
                           ((optional<ktxLevelIndexEntry> *)0x1688ae);
        pvVar2 = (void *)pkVar9->byteOffset;
        puVar11 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             this_01);
        std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x1688ef);
        local_158 = local_3a8;
        local_160 = "level {} data";
        local_110 = "level {} data";
        local_3a8[0] = "level {} data";
        local_108 = local_158;
        local_188 = std::char_traits<char>::length((char_type *)0x168966);
        local_18 = local_160;
        local_168 = local_398;
        local_178 = local_3a8[0];
        local_180 = &local_2bc;
        local_70 = &local_178;
        local_190 = local_3a8[0];
        sStack_170 = local_188;
        local_68 = local_190;
        sStack_60 = local_188;
        local_1b8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                                   *)&local_180->string,pvVar13,(uint *)local_168);
        local_f8 = &local_1a0;
        local_100 = local_1b8;
        local_e8 = 2;
        local_1a0 = 2;
        args.field_1.values_ = aVar20.values_;
        args.desc_ = in_stack_fffffffffffffce8;
        local_f0 = local_100;
        local_e0 = local_f8;
        local_d8 = local_100;
        local_198 = local_100;
        ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffcf8,args);
        auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view(local_398);
        local_378 = auVar14;
        read(in_RDI,(int)pvVar8,pvVar2,(size_t)puVar11);
        std::__cxx11::string::~string(local_398);
        local_368 = local_368 + 1;
      }
      puVar11 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                          ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                           this_01);
      this_00 = (DiffMismatch *)
                std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                          (auVar14._8_8_);
      pkVar9 = std::optional<ktxLevelIndexEntry>::operator->
                         ((optional<ktxLevelIndexEntry> *)0x168c6a);
      iVar4 = memcmp(puVar11,this_00,pkVar9->byteLength);
      if (iVar4 != 0) {
        local_339 = 1;
      }
      local_518 = auStack_348;
      do {
        local_518 = local_518 + -8;
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  (auVar14._8_8_);
      } while (local_518 != local_358);
    }
    if ((local_339 & 1) != 0) {
      local_148 = local_408;
      local_150 = "Mismatch in level {} data";
      local_120 = "Mismatch in level {} data";
      local_408[0] = (v10 *)0x387005;
      in_stack_fffffffffffffa98 = local_268;
      local_118 = local_148;
      local_1e0 = std::char_traits<char>::length((char_type *)0x168d8d);
      local_10 = local_150;
      local_1d0 = local_408[0];
      local_1d8 = &local_2bc;
      local_50 = &local_1d0;
      local_1e8 = local_408[0];
      sStack_1c8 = local_1e0;
      local_1c0 = local_3f8;
      local_48 = local_1e8;
      sStack_40 = local_1e0;
      local_208[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                                 *)&local_1d8->string,(v10 *)this_00,(uint *)local_3f8);
      local_c8 = &local_1f8;
      local_d0 = local_208;
      local_b8 = 2;
      local_1f8 = 2;
      args_00.field_1.values_ = aVar20.values_;
      args_00.desc_ = in_stack_fffffffffffffce8;
      pvVar13 = local_1e8;
      local_c0 = local_d0;
      local_b0 = local_c8;
      local_a8 = local_d0;
      local_1f0 = local_d0;
      ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffcf8,args_00);
      sVar15 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_3f8);
      local_138 = &local_448;
      local_140 = "m={}";
      local_130 = "m={}";
      local_448 = "m={}";
      psVar18 = &local_440;
      local_128 = local_138;
      local_3d8 = sVar15;
      sVar12 = std::char_traits<char>::length((char_type *)0x168f75);
      *psVar18 = sVar12;
      local_8 = local_140;
      local_210 = local_438;
      local_220 = local_448;
      sStack_218 = local_440;
      local_228 = &local_2bc;
      local_30 = &local_220;
      local_238 = local_448;
      local_28 = local_238;
      in_stack_fffffffffffffa90 =
           (PrintDiff *)
           ::fmt::v10::
           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                       *)&local_228->string,pvVar13,(uint *)local_210);
      local_98 = &local_248;
      local_a0 = local_258;
      local_88 = 2;
      local_248 = 2;
      args_01.field_1.values_ = aVar20.values_;
      args_01.desc_ = in_stack_fffffffffffffce8;
      in_stack_fffffffffffffa88 = extraout_RDX;
      local_258[0] = in_stack_fffffffffffffa90;
      local_90 = local_a0;
      local_80 = local_98;
      local_78 = local_a0;
      local_240 = local_a0;
      ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffcf8,args_01);
      sVar15 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_438);
      local_418 = sVar15;
      DiffMismatch::DiffMismatch(&local_3c8,local_3d8,sVar15);
      this_00 = &local_3c8;
      PrintDiff::operator<<(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      std::__cxx11::string::~string(local_438);
      std::__cxx11::string::~string(local_3f8);
    }
    local_2bc.int_value = local_2bc.int_value + 1;
  } while( true );
}

Assistant:

void CommandCompare::compareImagesRaw(PrintDiff& diff, InputStreams& streams) {
    diff.setContext("Image Data\n\n");

    const uint32_t numLevels[] = {
        std::max(1u, headers[0].levelCount),
        std::max(1u, headers[1].levelCount)
    };
    const uint32_t maxNumLevels = std::max(numLevels[0], numLevels[1]);

    for (uint32_t level = 0; level < maxNumLevels; ++level) {
        const auto levelIndexEntryOffset = sizeof(KTX_header2) + level * sizeof(ktxLevelIndexEntry);
        std::optional<ktxLevelIndexEntry> levelIndexEntry[2];
        for (std::size_t i = 0; i < streams.size(); ++i)
            if (level < numLevels[i]) {
                ktxLevelIndexEntry entry;
                read(streams[i], levelIndexEntryOffset, &entry, sizeof(entry), "the level index");
                levelIndexEntry[i] = entry;
            }

        bool mismatch = false;

        // Missing levels are always considered a mismatch
        if (!levelIndexEntry[0].has_value() || !levelIndexEntry[1].has_value())
            mismatch = true;

        // Mismatching level data sizes are always considered a mismatch
        if (!mismatch && levelIndexEntry[0]->byteLength != levelIndexEntry[1]->byteLength)
            mismatch = true;

        if (!mismatch) {
            // If so far so good then load the level data and compare them
            std::unique_ptr<uint8_t[]> buffers[] = {
                std::make_unique<uint8_t[]>(levelIndexEntry[0]->byteLength),
                std::make_unique<uint8_t[]>(levelIndexEntry[1]->byteLength)
            };

            for (std::size_t i = 0; i < streams.size(); ++i)
                read(streams[i], levelIndexEntry[i]->byteOffset, buffers[i].get(),
                    levelIndexEntry[i]->byteLength, fmt::format("level {} data", level));

            if (std::memcmp(buffers[0].get(), buffers[1].get(), levelIndexEntry[0]->byteLength) != 0)
                mismatch = true;
        }

        if (mismatch)
            diff << DiffMismatch(fmt::format("Mismatch in level {} data", level), fmt::format("m={}", level));
    }
}